

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O3

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::executeSingleThreadedImpl
          (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *this)

{
  atomic<bool> *paVar1;
  __int_type _Var2;
  pointer ptVar3;
  code *pcVar4;
  eAssertResult eVar5;
  ulong uVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar7;
  __int_type_conflict _Var8;
  long lVar9;
  
  uVar6 = 0;
  paVar1 = &(this->
            super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
            ).super_task_group_base.super_task_base.grabbed_;
  LOCK();
  _Var2 = (paVar1->_M_base)._M_i;
  if (_Var2 == false) {
    (paVar1->_M_base)._M_i = true;
  }
  else {
    uVar6 = (ulong)_Var2;
  }
  UNLOCK();
  if (_Var2 == false) {
    lVar7 = (long)(this->tasks_).
                  super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->tasks_).
                  super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar7 == 0) {
      eVar5 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                              ,0x34,"taskCount > 0","",in_R8,in_R9,uVar6);
      if (eVar5 == eAR_Retry) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    else {
      _Var8 = lVar7 >> 4;
      if ((executeSingleThreadedImpl::always_ignore == false) &&
         (_Var8 != (this->activeTasksCount_).super___atomic_base<unsigned_long>._M_i)) {
        eVar5 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                                ,0x36,"(taskCount == activeTasksCount_)","",in_R8,in_R9,uVar6);
        if (eVar5 == eAR_AlwaysIgnore) {
          executeSingleThreadedImpl::always_ignore = true;
        }
        else if (eVar5 == eAR_Retry) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      lVar7 = _Var8 + (_Var8 == 0);
      lVar9 = 0;
      do {
        ptVar3 = (this->tasks_).
                 super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                 super__Vector_impl_data._M_start;
        task_handle::validate
                  ((task_handle *)
                   ((long)&(ptVar3->spTask_).
                           super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                   lVar9));
        (**(code **)(**(long **)((long)&(ptVar3->spTask_).
                                        super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + lVar9) + 0x18))();
        lVar9 = lVar9 + 0x10;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::clear(&this->tasks_);
    return;
  }
  return;
}

Assistant:

virtual void executeSingleThreadedImpl() override final
        {
            if (task_base::tryGrab())
            {
                const auto taskCount = tasks_.size();
                if (oqpi_ensure(taskCount > 0))
                {
                    oqpi_check(taskCount == activeTasksCount_);
                    for (size_t i = 0; i < taskCount; ++i)
                    {
                        tasks_[i].executeSingleThreaded();
                    }
                }
                tasks_.clear();
            }
        }